

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O3

void __thiscall DROPlayer::WriteReg(DROPlayer *this,UINT8 port,UINT8 reg,UINT8 data)

{
  pointer pDVar1;
  void *pvVar2;
  UINT8 UVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  ulong uVar5;
  
  uVar4 = (ulong)((uint)CONCAT71(in_register_00000031,port) >> (this->_portShift & 0x1f));
  pDVar1 = (this->_devices).
           super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(this->_devices).
                 super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1 >> 3) *
          -0x30c30c30c30c30c3;
  if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
    pvVar2 = pDVar1[uVar4].base.defInf.dataPtr;
    if (pvVar2 != (void *)0x0) {
      if (pDVar1[uVar4].write != (DEVFUNC_WRITE_A8D8)0x0) {
        UVar3 = (port & this->_portMask) * '\x02';
        (*pDVar1[uVar4].write)(pvVar2,UVar3,reg);
        (*pDVar1[uVar4].write)(pvVar2,UVar3 + '\x01',data);
        return;
      }
    }
  }
  return;
}

Assistant:

void DROPlayer::WriteReg(UINT8 port, UINT8 reg, UINT8 data)
{
	UINT8 devID = port >> _portShift;
	
	if (devID >= _devices.size())
		return;
	DRO_CHIPDEV* cDev = &_devices[devID];
	DEV_DATA* dataPtr = cDev->base.defInf.dataPtr;
	if (dataPtr == NULL || cDev->write == NULL)
		return;
	
	port &= _portMask;
	cDev->write(dataPtr, (port << 1) | 0, reg);
	cDev->write(dataPtr, (port << 1) | 1, data);
	
	return;
}